

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastDecimalToNumeric<short,duckdb::hugeint_t>
               (short input,hugeint_t *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  string *msg;
  undefined7 in_register_00000009;
  undefined6 in_register_0000003a;
  PhysicalType params_1;
  allocator local_59;
  Exception local_58 [2];
  string error;
  
  params_1 = UINT8;
  msg = (string *)
        (((long)((-(ulong)((ushort)input >> 0xf) ^
                 *(ulong *)(NumericHelper::POWERS_OF_TEN +
                           (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8)) +
                (ulong)((ushort)input >> 0xf)) / 2 + (long)(int)CONCAT62(in_register_0000003a,input)
         ) / (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                             (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  bVar1 = Hugeint::TryConvert<short>((int16_t)msg,result);
  if (!bVar1) {
    ::std::__cxx11::string::string
              ((string *)local_58,"Failed to cast decimal value %d to type %s",&local_59);
    Exception::ConstructMessage<long,duckdb::PhysicalType>(&error,local_58,msg,0xcc,params_1);
    ::std::__cxx11::string::~string((string *)local_58);
    HandleCastError::AssignError(&error,parameters);
    ::std::__cxx11::string::~string((string *)&error);
  }
  return bVar1;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}